

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder *pDecoder,ma_uint64 *pLength)

{
  ma_result mVar1;
  long *plVar2;
  ma_uint64 internalLengthInPCMFrames;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 local_28;
  ma_uint32 local_1c;
  undefined1 local_18 [4];
  undefined1 local_14 [4];
  
  if (pLength == (ma_uint64 *)0x0) {
    return MA_INVALID_ARGS;
  }
  *pLength = 0;
  if (pDecoder == (ma_decoder *)0x0) {
    return MA_INVALID_ARGS;
  }
  plVar2 = (long *)pDecoder->pBackend;
  if (plVar2 == (long *)0x0) {
    return MA_NO_BACKEND;
  }
  local_28 = 0;
  if (plVar2[2] == -1) {
    if (*(code **)(*plVar2 + 0x20) == (code *)0x0) {
      return MA_NOT_IMPLEMENTED;
    }
    mVar1 = (**(code **)(*plVar2 + 0x20))(plVar2,&local_28);
    if (mVar1 != MA_SUCCESS) {
      return mVar1;
    }
    plVar2 = (long *)pDecoder->pBackend;
    if (plVar2 == (long *)0x0) {
      return MA_INVALID_ARGS;
    }
  }
  else {
    local_28 = plVar2[2] - plVar2[1];
  }
  if (*(code **)(*plVar2 + 0x10) == (code *)0x0) {
    return MA_NOT_IMPLEMENTED;
  }
  mVar1 = (**(code **)(*plVar2 + 0x10))(plVar2,local_14,local_18,&local_1c,0,0);
  if (mVar1 == MA_SUCCESS) {
    if (local_1c != pDecoder->outputSampleRate) {
      local_28 = ma_calculate_frame_count_after_resampling
                           (pDecoder->outputSampleRate,local_1c,local_28);
    }
    *pLength = local_28;
    return MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder* pDecoder, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalLengthInPCMFrames;
        ma_uint32 internalSampleRate;

        result = ma_data_source_get_length_in_pcm_frames(pDecoder->pBackend, &internalLengthInPCMFrames);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal length. */
        }

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;   /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            *pLength = internalLengthInPCMFrames;
        } else {
            *pLength = ma_calculate_frame_count_after_resampling(pDecoder->outputSampleRate, internalSampleRate, internalLengthInPCMFrames);
        }

        return MA_SUCCESS;
    } else {
        return MA_NO_BACKEND;
    }
}